

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

string * __thiscall
libtorrent::aux::latin1_utf8_abi_cxx11_(string *__return_storage_ptr__,aux *this,span<const_char> s)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (pcVar1 = (char *)0x0; s.m_ptr != pcVar1; pcVar1 = pcVar1 + 1) {
    append_utf8_codepoint(__return_storage_ptr__,(uint)(byte)this[(long)pcVar1]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string latin1_utf8(span<char const> s)
	{
		std::string ret;
		for (char const c : s)
		{
			std::int32_t const cp = static_cast<unsigned char>(c);
			append_utf8_codepoint(ret, cp);
		}
		return ret;
	}